

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

void wal_set_dirty_status(filemgr *file,wal_dirty_t status,bool set_on_non_pending)

{
  byte in_DL;
  undefined1 in_SIL;
  long in_RDI;
  
  pthread_spin_lock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x48) + 0x60));
  if (((in_DL & 1) == 0) || (*(char *)(*(long *)(in_RDI + 0x48) + 0x30) != '\x02')) {
    *(undefined1 *)(*(long *)(in_RDI + 0x48) + 0x30) = in_SIL;
    pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x48) + 0x60));
  }
  else {
    pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x48) + 0x60));
  }
  return;
}

Assistant:

void wal_set_dirty_status(struct filemgr *file,
                          wal_dirty_t status,
                          bool set_on_non_pending)
{
    spin_lock(&file->wal->lock);
    if (set_on_non_pending && file->wal->wal_dirty == FDB_WAL_PENDING) {
        spin_unlock(&file->wal->lock);
        return;
    }
    file->wal->wal_dirty = status;
    spin_unlock(&file->wal->lock);
}